

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcher.cpp
# Opt level: O1

void cbtCollisionDispatcher::defaultNearCallback
               (cbtBroadphasePair *collisionPair,cbtCollisionDispatcher *dispatcher,
               cbtDispatcherInfo *dispatchInfo)

{
  cbtCollisionObject *pcVar1;
  cbtCollisionObject *pcVar2;
  cbtCollisionAlgorithm *pcVar3;
  int iVar4;
  undefined4 extraout_var;
  float extraout_XMM0_Da;
  cbtCollisionObjectWrapper obj1Wrap;
  cbtCollisionObjectWrapper obj0Wrap;
  cbtManifoldResult contactPointResult;
  cbtCollisionObjectWrapper local_b0;
  cbtCollisionObjectWrapper local_88;
  cbtManifoldResult local_60;
  
  pcVar1 = (cbtCollisionObject *)collisionPair->m_pProxy0->m_clientObject;
  pcVar2 = (cbtCollisionObject *)collisionPair->m_pProxy1->m_clientObject;
  iVar4 = (*(dispatcher->super_cbtDispatcher)._vptr_cbtDispatcher[6])(dispatcher,pcVar1,pcVar2);
  if ((char)iVar4 != '\0') {
    local_88.m_shape = pcVar1->m_collisionShape;
    local_88.m_worldTransform = &pcVar1->m_worldTransform;
    local_88.m_parent = (cbtCollisionObjectWrapper *)0x0;
    local_88.m_partId = -1;
    local_88.m_index = -1;
    local_b0.m_shape = pcVar2->m_collisionShape;
    local_b0.m_worldTransform = &pcVar2->m_worldTransform;
    local_b0.m_parent = (cbtCollisionObjectWrapper *)0x0;
    local_b0.m_partId = -1;
    local_b0.m_index = -1;
    local_b0.m_collisionObject = pcVar2;
    local_88.m_collisionObject = pcVar1;
    if (collisionPair->m_algorithm == (cbtCollisionAlgorithm *)0x0) {
      iVar4 = (*(dispatcher->super_cbtDispatcher)._vptr_cbtDispatcher[2])
                        (dispatcher,&local_88,&local_b0,0,1);
      collisionPair->m_algorithm = (cbtCollisionAlgorithm *)CONCAT44(extraout_var,iVar4);
    }
    if (collisionPair->m_algorithm != (cbtCollisionAlgorithm *)0x0) {
      cbtManifoldResult::cbtManifoldResult(&local_60,&local_88,&local_b0);
      pcVar3 = collisionPair->m_algorithm;
      if (dispatchInfo->m_dispatchFunc == 1) {
        (*pcVar3->_vptr_cbtCollisionAlgorithm[2])(pcVar3,&local_88,&local_b0,dispatchInfo,&local_60)
        ;
      }
      else {
        (*pcVar3->_vptr_cbtCollisionAlgorithm[3])(pcVar3,pcVar1,pcVar2,dispatchInfo,&local_60);
        if (extraout_XMM0_Da < dispatchInfo->m_timeOfImpact) {
          dispatchInfo->m_timeOfImpact = extraout_XMM0_Da;
        }
      }
    }
  }
  return;
}

Assistant:

void cbtCollisionDispatcher::defaultNearCallback(cbtBroadphasePair& collisionPair, cbtCollisionDispatcher& dispatcher, const cbtDispatcherInfo& dispatchInfo)
{
	cbtCollisionObject* colObj0 = (cbtCollisionObject*)collisionPair.m_pProxy0->m_clientObject;
	cbtCollisionObject* colObj1 = (cbtCollisionObject*)collisionPair.m_pProxy1->m_clientObject;

	if (dispatcher.needsCollision(colObj0, colObj1))
	{
		cbtCollisionObjectWrapper obj0Wrap(0, colObj0->getCollisionShape(), colObj0, colObj0->getWorldTransform(), -1, -1);
		cbtCollisionObjectWrapper obj1Wrap(0, colObj1->getCollisionShape(), colObj1, colObj1->getWorldTransform(), -1, -1);

		//dispatcher will keep algorithms persistent in the collision pair
		if (!collisionPair.m_algorithm)
		{
			collisionPair.m_algorithm = dispatcher.findAlgorithm(&obj0Wrap, &obj1Wrap, 0, BT_CONTACT_POINT_ALGORITHMS);
		}

		if (collisionPair.m_algorithm)
		{
			cbtManifoldResult contactPointResult(&obj0Wrap, &obj1Wrap);

			if (dispatchInfo.m_dispatchFunc == cbtDispatcherInfo::DISPATCH_DISCRETE)
			{
				//discrete collision detection query

				collisionPair.m_algorithm->processCollision(&obj0Wrap, &obj1Wrap, dispatchInfo, &contactPointResult);
			}
			else
			{
				//continuous collision detection query, time of impact (toi)
				cbtScalar toi = collisionPair.m_algorithm->calculateTimeOfImpact(colObj0, colObj1, dispatchInfo, &contactPointResult);
				if (dispatchInfo.m_timeOfImpact > toi)
					dispatchInfo.m_timeOfImpact = toi;
			}
		}
	}
}